

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableHeader(char *label)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  ImGuiWindow *pIVar6;
  ImGuiTable *pIVar7;
  ImDrawList *draw_list;
  undefined8 this;
  undefined8 text;
  undefined8 uVar8;
  bool bVar9;
  ImGuiID id;
  ImU32 IVar10;
  ImGuiSortDirection sort_direction;
  ImGuiTableColumn *pIVar11;
  char *pcVar12;
  ImGuiTableColumn *pIVar13;
  long lVar14;
  bool bVar15;
  uint uVar16;
  uint uVar17;
  ImVec2 IVar18;
  ImVec2 pos;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  bool held;
  bool hovered;
  char sort_order_suf [4];
  ImVec2 label_pos;
  ImVec2 label_size;
  ImRect bb;
  bool local_11e;
  bool local_11d;
  float local_11c;
  undefined1 local_118 [16];
  char local_fc [4];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  ImGuiTableColumn *local_c8;
  float local_c0;
  float local_bc;
  long local_b8;
  ImVec2 local_b0;
  undefined1 local_a8 [16];
  char *local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  undefined1 local_78 [16];
  ImRect local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 extraout_XMM0_Qb_00;
  
  local_118._8_8_ = local_118._0_8_;
  pIVar6 = GImGui->CurrentWindow;
  if (pIVar6->SkipItems != false) {
    return;
  }
  local_f8._8_8_ = local_f8._0_8_;
  local_f8._0_8_ = GImGui;
  pIVar7 = GImGui->CurrentTable;
  iVar5 = pIVar7->CurrentColumn;
  lVar14 = (long)iVar5;
  pIVar13 = (pIVar7->Columns).Data + lVar14;
  pcVar12 = "";
  if (label != (char *)0x0) {
    pcVar12 = label;
  }
  local_98 = FindRenderedTextEnd(pcVar12,(char *)0x0);
  IVar18 = CalcTextSize(pcVar12,local_98,true,-1.0);
  auVar26._8_4_ = (int)extraout_XMM0_Qb;
  auVar26._0_4_ = IVar18.x;
  auVar26._4_4_ = IVar18.y;
  auVar26._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  local_b0 = (pIVar6->DC).CursorPos;
  pIVar11 = (pIVar7->Columns).Data;
  fVar21 = pIVar11[lVar14].MinX;
  fVar1 = pIVar11[lVar14].MaxX;
  fVar2 = (pIVar7->WorkRect).Min.x;
  uVar16 = -(uint)(fVar2 <= fVar21);
  local_e8 = ZEXT416(~uVar16 & (uint)fVar2 | (uint)fVar21 & uVar16);
  fVar21 = (pIVar7->WorkRect).Max.x;
  if (fVar21 <= fVar1) {
    fVar1 = fVar21;
  }
  local_d8 = ZEXT416((uint)fVar1);
  local_11c = pIVar7->RowPosY1;
  local_48 = ZEXT416((uint)pIVar7->RowPosY2);
  fVar21 = pIVar7->RowMinHeight - (pIVar7->CellPaddingY + pIVar7->CellPaddingY);
  uVar16 = -(uint)(fVar21 <= IVar18.y);
  local_78 = ZEXT416(~uVar16 & (uint)fVar21 | (uint)IVar18.y & uVar16);
  local_fc[0] = '\0';
  local_fc[1] = '\0';
  local_fc[2] = '\0';
  local_fc[3] = '\0';
  fVar21 = local_b0.x;
  auVar20 = ZEXT816(0);
  uVar8 = local_f8._0_8_;
  local_c8 = pIVar13;
  local_90 = local_b0;
  local_88 = IVar18;
  local_118._0_8_ = pIVar6;
  if (((pIVar7->Flags & 8) == 0) || ((pIVar13->Flags & 0x200) != 0)) {
    local_a8._0_4_ = 0.0;
    local_a8._4_4_ = 0;
    local_a8._8_4_ = 0;
    local_a8._12_4_ = 0;
  }
  else {
    local_a8._0_4_ =
         (undefined4)
         (int)(*(float *)(local_f8._0_8_ + 0x3c00) * 0.65 + *(float *)(local_f8._0_8_ + 0x381c));
    local_a8._4_4_ = 0;
    local_a8._8_4_ = 0;
    local_a8._12_4_ = 0;
    if ('\0' < pIVar13->SortOrder) {
      local_a8 = ZEXT416((uint)local_a8._0_4_);
      local_bc = fVar21;
      local_58 = auVar26;
      ImFormatString(local_fc,4,"%d");
      pIVar13 = local_c8;
      local_c0 = *(float *)(uVar8 + 0x3834);
      auVar19._0_8_ = CalcTextSize(local_fc,(char *)0x0,false,-1.0);
      auVar19._8_8_ = extraout_XMM0_Qb_00;
      auVar20._4_12_ = auVar19._4_12_;
      auVar20._0_4_ = auVar19._0_4_ + local_c0;
      fVar21 = local_bc;
      IVar18 = (ImVec2)local_58._0_8_;
    }
  }
  this = local_118._0_8_;
  fVar21 = IVar18.x + fVar21 + auVar20._0_4_ + (float)local_a8._0_4_;
  uVar3 = pIVar13->ContentMaxXHeadersUsed;
  uVar4 = pIVar13->ContentMaxXHeadersIdeal;
  uVar16 = -(uint)(pIVar13->WorkMaxX <= (float)uVar3);
  uVar17 = -(uint)(fVar21 <= (float)uVar4);
  uVar25 = CONCAT44(~uVar17 & (uint)fVar21,~uVar16 & (uint)pIVar13->WorkMaxX) |
           CONCAT44(uVar4 & uVar17,uVar3 & uVar16);
  pIVar13->ContentMaxXHeadersUsed = (float)(int)uVar25;
  pIVar13->ContentMaxXHeadersIdeal = (float)(int)(uVar25 >> 0x20);
  if (pIVar7->IsContextPopupOpen == true) {
    if (iVar5 == pIVar7->ContextPopupColumn) {
      bVar15 = pIVar7->InstanceInteracted == pIVar7->InstanceCurrent;
    }
    else {
      bVar15 = false;
    }
  }
  else {
    bVar15 = false;
  }
  local_118._0_8_ = pcVar12;
  local_f8 = auVar20;
  local_b8 = lVar14;
  id = ImGuiWindow::GetID((ImGuiWindow *)this,pcVar12,(char *)0x0);
  fVar21 = *(float *)(uVar8 + 0x3840) + *(float *)(uVar8 + 0x3840) +
           local_11c + (float)local_78._0_4_;
  uVar16 = -(uint)(fVar21 <= (float)local_48._0_4_);
  local_68.Max.y = (float)(uVar16 & local_48._0_4_ | ~uVar16 & (uint)fVar21);
  local_68.Min.x = (float)local_e8._0_4_;
  local_68.Min.y = local_11c;
  local_68.Max.x = (float)local_d8._0_4_;
  local_80.x = 0.0;
  local_80.y = (float)local_78._0_4_;
  ItemSize(&local_80,-1.0);
  bVar9 = ItemAdd(&local_68,id,(ImRect *)0x0,0);
  if (!bVar9) {
    return;
  }
  bVar9 = ButtonBehavior(&local_68,id,&local_11d,&local_11e,0x1000);
  local_11c = (float)CONCAT31(local_11c._1_3_,bVar9);
  if (*(ImGuiID *)(uVar8 + 0x3eec) != id) {
    SetItemAllowOverlap();
  }
  lVar14 = local_b8;
  pIVar13 = local_c8;
  local_b0 = (ImVec2)((ulong)local_b0 >> 0x20);
  iVar5 = (int)local_b8;
  if (((local_11e | local_11d) & 1U) == 0 && !bVar15) {
    uVar16 = 0x2a;
    if ((pIVar7->field_0x98 & 1) != 0) goto LAB_002336d5;
  }
  else {
    uVar16 = 0x1a;
    if (local_11e == false) {
      uVar16 = local_11d & 1 | 0x18;
    }
  }
  IVar10 = GetColorU32(uVar16,1.0);
  TableSetBgColor(3,IVar10,pIVar7->CurrentColumn);
LAB_002336d5:
  RenderNavHighlight(&local_68,id,10);
  auVar26 = local_118;
  text = local_118._0_8_;
  if (local_11e == false) {
    (((ImGuiWindowTempData *)(this + 0xe0))->CursorPos).y =
         *(float *)(uVar8 + 0x3830) * -0.5 + (((ImGuiWindowTempData *)(this + 0xe0))->CursorPos).y;
  }
  else {
    pIVar7->HeldHeaderColumn = (ImGuiTableColumnIdx)lVar14;
    (((ImGuiWindowTempData *)(this + 0xe0))->CursorPos).y =
         *(float *)(uVar8 + 0x3830) * -0.5 + (((ImGuiWindowTempData *)(this + 0xe0))->CursorPos).y;
    if ((pIVar7->Flags & 2) != 0) {
      bVar15 = IsMouseDragging(0,-1.0);
      if ((bVar15) && (*(char *)(uVar8 + 0x4a14) == '\0')) {
        pIVar7->ReorderColumn = (ImGuiTableColumnIdx)lVar14;
        pIVar7->InstanceInteracted = pIVar7->InstanceCurrent;
        fVar21 = *(float *)(uVar8 + 0xf8);
        if (((fVar21 < 0.0) &&
            (((*(float *)(uVar8 + 0xdfc) <= (float)local_e8._0_4_ &&
               (float)local_e8._0_4_ != *(float *)(uVar8 + 0xdfc) &&
              ((long)pIVar13->PrevEnabledColumn != -1)) &&
             (pIVar11 = (pIVar7->Columns).Data, pIVar11 != (ImGuiTableColumn *)0x0)))) &&
           ((pIVar11 = pIVar11 + pIVar13->PrevEnabledColumn,
            ((pIVar11->Flags | pIVar13->Flags) & 0x40U) == 0 &&
            (pIVar13->IndexWithinEnabledSet < pIVar7->FreezeColumnsRequest !=
             pIVar7->FreezeColumnsRequest <= pIVar11->IndexWithinEnabledSet)))) {
          pIVar7->ReorderColumnDir = -1;
          fVar21 = *(float *)(uVar8 + 0xf8);
        }
        if (((0.0 < fVar21) && ((float)local_d8._0_4_ < *(float *)(uVar8 + 0xdfc))) &&
           (((long)pIVar13->NextEnabledColumn != -1 &&
            (((pIVar11 = (pIVar7->Columns).Data, pIVar11 != (ImGuiTableColumn *)0x0 &&
              (pIVar11 = pIVar11 + pIVar13->NextEnabledColumn,
              ((pIVar11->Flags | pIVar13->Flags) & 0x40U) == 0)) &&
             (pIVar13->IndexWithinEnabledSet < pIVar7->FreezeColumnsRequest !=
              pIVar7->FreezeColumnsRequest <= pIVar11->IndexWithinEnabledSet)))))) {
          pIVar7->ReorderColumnDir = '\x01';
        }
      }
    }
  }
  local_d8._0_4_ = ((float)local_d8._0_4_ - (float)local_a8._0_4_) - (float)local_f8._0_4_;
  fVar21 = local_b0.x;
  if (((pIVar7->Flags & 8) != 0) && ((pIVar13->Flags & 0x200) == 0)) {
    uVar22 = 0;
    uVar23 = 0;
    uVar24 = 0;
    if (pIVar13->SortOrder != -1) {
      local_118 = ZEXT416((uint)local_b0.x);
      local_e8._4_4_ = local_d8._4_4_ & local_e8._4_4_;
      local_e8._0_4_ =
           ~-(uint)((float)local_d8._0_4_ <= (float)local_e8._0_4_) & local_d8._0_4_ |
           -(uint)((float)local_d8._0_4_ <= (float)local_e8._0_4_) & local_e8._0_4_;
      local_e8._8_4_ = local_d8._8_4_ & local_e8._8_4_;
      local_e8._12_4_ = local_d8._12_4_ & local_e8._12_4_;
      if ('\0' < pIVar13->SortOrder) {
        IVar10 = GetColorU32(0,0.7);
        PushStyleColor(0,IVar10);
        IVar18.x = *(float *)(uVar8 + 0x3834) + (float)local_e8._0_4_;
        IVar18.y = (float)local_118._0_4_;
        RenderText(IVar18,local_fc,(char *)0x0,true);
        PopStyleColor(1);
        local_e8._0_4_ = (float)local_e8._0_4_ + (float)local_f8._0_4_;
      }
      draw_list = *(ImDrawList **)(this + 0x278);
      IVar10 = GetColorU32(0,1.0);
      pIVar13 = local_c8;
      pos.y = (float)local_118._0_4_;
      pos.x = (float)local_e8._0_4_;
      RenderArrow(draw_list,pos,IVar10,(local_c8->field_0x65 & 3) == 1 ^ 3,0.65);
      fVar21 = (float)local_118._0_4_;
      uVar22 = local_118._4_4_;
      uVar23 = local_118._8_4_;
      uVar24 = local_118._12_4_;
    }
    if ((local_11c._0_1_ != '\0') && (iVar5 != pIVar7->ReorderColumn)) {
      local_118._4_4_ = uVar22;
      local_118._0_4_ = fVar21;
      local_118._8_4_ = uVar23;
      local_118._12_4_ = uVar24;
      sort_direction = TableGetColumnNextSortDirection(pIVar13);
      TableSetColumnSortDirection(iVar5,sort_direction,*(bool *)(uVar8 + 0xe15));
      fVar21 = (float)local_118._0_4_;
    }
  }
  pcVar12 = local_98;
  local_80.y = (float)local_78._0_4_ + fVar21 + *(float *)(uVar8 + 0x3820);
  local_80.x = (float)local_d8._0_4_;
  RenderTextEllipsis(*(ImDrawList **)(this + 0x278),&local_90,&local_80,(float)local_d8._0_4_,
                     (float)local_d8._0_4_,(char *)text,local_98,&local_88);
  if (((((float)local_d8._0_4_ - local_90.x < local_88.x) && (local_11d == true)) &&
      (*(int *)(uVar8 + 0x3eec) == 0)) && (bVar15 = IsItemHovered(0x800), bVar15)) {
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar12 - auVar26._0_4_),text);
  }
  bVar15 = IsMouseReleased(1);
  if ((bVar15) && (bVar15 = IsItemHovered(0), bVar15)) {
    TableOpenContextMenu(iVar5);
  }
  return;
}

Assistant:

void ImGui::TableHeader(const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeader() after BeginTable()!");
    IM_ASSERT(table->CurrentColumn != -1);
    const int column_n = table->CurrentColumn;
    ImGuiTableColumn* column = &table->Columns[column_n];

    // Label
    if (label == NULL)
        label = "";
    const char* label_end = FindRenderedTextEnd(label);
    ImVec2 label_size = CalcTextSize(label, label_end, true);
    ImVec2 label_pos = window->DC.CursorPos;

    // If we already got a row height, there's use that.
    // FIXME-TABLE: Padding problem if the correct outer-padding CellBgRect strays off our ClipRect?
    ImRect cell_r = TableGetCellBgRect(table, column_n);
    float label_height = ImMax(label_size.y, table->RowMinHeight - table->CellPaddingY * 2.0f);

    // Calculate ideal size for sort order arrow
    float w_arrow = 0.0f;
    float w_sort_text = 0.0f;
    char sort_order_suf[4] = "";
    const float ARROW_SCALE = 0.65f;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        w_arrow = ImFloor(g.FontSize * ARROW_SCALE + g.Style.FramePadding.x);
        if (column->SortOrder > 0)
        {
            ImFormatString(sort_order_suf, IM_ARRAYSIZE(sort_order_suf), "%d", column->SortOrder + 1);
            w_sort_text = g.Style.ItemInnerSpacing.x + CalcTextSize(sort_order_suf).x;
        }
    }

    // We feed our unclipped width to the column without writing on CursorMaxPos, so that column is still considering for merging.
    float max_pos_x = label_pos.x + label_size.x + w_sort_text + w_arrow;
    column->ContentMaxXHeadersUsed = ImMax(column->ContentMaxXHeadersUsed, column->WorkMaxX);
    column->ContentMaxXHeadersIdeal = ImMax(column->ContentMaxXHeadersIdeal, max_pos_x);

    // Keep header highlighted when context menu is open.
    const bool selected = (table->IsContextPopupOpen && table->ContextPopupColumn == column_n && table->InstanceInteracted == table->InstanceCurrent);
    ImGuiID id = window->GetID(label);
    ImRect bb(cell_r.Min.x, cell_r.Min.y, cell_r.Max.x, ImMax(cell_r.Max.y, cell_r.Min.y + label_height + g.Style.CellPadding.y * 2.0f));
    ItemSize(ImVec2(0.0f, label_height)); // Don't declare unclipped width, it'll be fed ContentMaxPosHeadersIdeal
    if (!ItemAdd(bb, id))
        return;

    //GetForegroundDrawList()->AddRect(cell_r.Min, cell_r.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]
    //GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]

    // Using AllowItemOverlap mode because we cover the whole cell, and we want user to be able to submit subsequent items.
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();
    if (held || hovered || selected)
    {
        const ImU32 col = GetColorU32(held ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        //RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        TableSetBgColor(ImGuiTableBgTarget_CellBg, col, table->CurrentColumn);
    }
    else
    {
        // Submit single cell bg color in the case we didn't submit a full header row
        if ((table->RowFlags & ImGuiTableRowFlags_Headers) == 0)
            TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_TableHeaderBg), table->CurrentColumn);
    }
    RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    if (held)
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)column_n;
    window->DC.CursorPos.y -= g.Style.ItemSpacing.y * 0.5f;

    // Drag and drop to re-order columns.
    // FIXME-TABLE: Scroll request while reordering a column and it lands out of the scrolling zone.
    if (held && (table->Flags & ImGuiTableFlags_Reorderable) && IsMouseDragging(0) && !g.DragDropActive)
    {
        // While moving a column it will jump on the other side of the mouse, so we also test for MouseDelta.x
        table->ReorderColumn = (ImGuiTableColumnIdx)column_n;
        table->InstanceInteracted = table->InstanceCurrent;

        // We don't reorder: through the frozen<>unfrozen line, or through a column that is marked with ImGuiTableColumnFlags_NoReorder.
        if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < cell_r.Min.x)
            if (ImGuiTableColumn* prev_column = (column->PrevEnabledColumn != -1) ? &table->Columns[column->PrevEnabledColumn] : NULL)
                if (!((column->Flags | prev_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (prev_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = -1;
        if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > cell_r.Max.x)
            if (ImGuiTableColumn* next_column = (column->NextEnabledColumn != -1) ? &table->Columns[column->NextEnabledColumn] : NULL)
                if (!((column->Flags | next_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (next_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = +1;
    }

    // Sort order arrow
    const float ellipsis_max = cell_r.Max.x - w_arrow - w_sort_text;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        if (column->SortOrder != -1)
        {
            float x = ImMax(cell_r.Min.x, cell_r.Max.x - w_arrow - w_sort_text);
            float y = label_pos.y;
            if (column->SortOrder > 0)
            {
                PushStyleColor(ImGuiCol_Text, GetColorU32(ImGuiCol_Text, 0.70f));
                RenderText(ImVec2(x + g.Style.ItemInnerSpacing.x, y), sort_order_suf);
                PopStyleColor();
                x += w_sort_text;
            }
            RenderArrow(window->DrawList, ImVec2(x, y), GetColorU32(ImGuiCol_Text), column->SortDirection == ImGuiSortDirection_Ascending ? ImGuiDir_Up : ImGuiDir_Down, ARROW_SCALE);
        }

        // Handle clicking on column header to adjust Sort Order
        if (pressed && table->ReorderColumn != column_n)
        {
            ImGuiSortDirection sort_direction = TableGetColumnNextSortDirection(column);
            TableSetColumnSortDirection(column_n, sort_direction, g.IO.KeyShift);
        }
    }

    // Render clipped label. Clipping here ensure that in the majority of situations, all our header cells will
    // be merged into a single draw call.
    //window->DrawList->AddCircleFilled(ImVec2(ellipsis_max, label_pos.y), 40, IM_COL32_WHITE);
    RenderTextEllipsis(window->DrawList, label_pos, ImVec2(ellipsis_max, label_pos.y + label_height + g.Style.FramePadding.y), ellipsis_max, ellipsis_max, label, label_end, &label_size);

    const bool text_clipped = label_size.x > (ellipsis_max - label_pos.x);
    if (text_clipped && hovered && g.ActiveId == 0 && IsItemHovered(ImGuiHoveredFlags_DelayNormal))
        SetTooltip("%.*s", (int)(label_end - label), label);

    // We don't use BeginPopupContextItem() because we want the popup to stay up even after the column is hidden
    if (IsMouseReleased(1) && IsItemHovered())
        TableOpenContextMenu(column_n);
}